

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod.c
# Opt level: O0

void initOpts(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  int iVar9;
  uint64_t uVar10;
  long lVar11;
  char **in_RSI;
  int in_EDI;
  int64_t mask;
  uint32_t addr;
  int i;
  int err;
  int opt;
  int *in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  int local_18;
  
  uVar1 = bufferSizeMilliseconds;
  uVar2 = clockMicros;
  uVar3 = clockPeripheral;
  uVar4 = DMAprimaryChannel;
  uVar5 = DMAsecondaryChannel;
  uVar6 = socketPort;
  uVar7 = memAllocMode;
  uVar8 = cfgInternals;
  while (cfgInternals = uVar8, memAllocMode = uVar7, socketPort = uVar6, DMAsecondaryChannel = uVar5
        , DMAprimaryChannel = uVar4, clockPeripheral = uVar3, clockMicros = uVar2,
        bufferSizeMilliseconds = uVar1, iVar9 = getopt(in_EDI,in_RSI,"a:b:c:d:e:fgkln:mp:s:t:x:vV"),
        iVar9 != -1) {
    uVar1 = bufferSizeMilliseconds;
    uVar2 = clockMicros;
    uVar3 = clockPeripheral;
    uVar4 = DMAprimaryChannel;
    uVar5 = DMAsecondaryChannel;
    uVar6 = socketPort;
    uVar7 = memAllocMode;
    uVar8 = cfgInternals;
    switch(iVar9) {
    case 0x56:
    case 0x76:
      printf("%d\n",0x44);
      exit(0);
    default:
      usage();
      exit(1);
    case 0x61:
      uVar10 = getNum((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffe4 = (uint)uVar10;
      if (((int)in_stack_ffffffffffffffe4 < 0) ||
         (uVar1 = bufferSizeMilliseconds, uVar2 = clockMicros, uVar3 = clockPeripheral,
         uVar4 = DMAprimaryChannel, uVar5 = DMAsecondaryChannel, uVar6 = socketPort,
         uVar7 = in_stack_ffffffffffffffe4, uVar8 = cfgInternals, 2 < (int)in_stack_ffffffffffffffe4
         )) {
        fatal("invalid -a option (%d)",uVar10 & 0xffffffff);
        uVar1 = bufferSizeMilliseconds;
        uVar2 = clockMicros;
        uVar3 = clockPeripheral;
        uVar4 = DMAprimaryChannel;
        uVar5 = DMAsecondaryChannel;
        uVar6 = socketPort;
        uVar7 = memAllocMode;
        uVar8 = cfgInternals;
      }
      break;
    case 0x62:
      uVar10 = getNum((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffe4 = (uint)uVar10;
      if (((int)in_stack_ffffffffffffffe4 < 100) ||
         (uVar1 = in_stack_ffffffffffffffe4, uVar2 = clockMicros, uVar3 = clockPeripheral,
         uVar4 = DMAprimaryChannel, uVar5 = DMAsecondaryChannel, uVar6 = socketPort,
         uVar7 = memAllocMode, uVar8 = cfgInternals, 10000 < (int)in_stack_ffffffffffffffe4)) {
        fatal("invalid -b option (%d)",uVar10 & 0xffffffff);
        uVar1 = bufferSizeMilliseconds;
        uVar2 = clockMicros;
        uVar3 = clockPeripheral;
        uVar4 = DMAprimaryChannel;
        uVar5 = DMAsecondaryChannel;
        uVar6 = socketPort;
        uVar7 = memAllocMode;
        uVar8 = cfgInternals;
      }
      break;
    case 99:
      uVar10 = getNum((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffe4 = (uint)uVar10;
      if (((int)in_stack_ffffffffffffffe4 < 0) ||
         (uVar1 = bufferSizeMilliseconds, uVar2 = clockMicros, uVar3 = clockPeripheral,
         uVar4 = DMAprimaryChannel, uVar5 = DMAsecondaryChannel, uVar6 = socketPort,
         uVar7 = memAllocMode, uVar8 = in_stack_ffffffffffffffe4,
         0x7ff < (int)in_stack_ffffffffffffffe4)) {
        fatal("invalid -c option (%x)",uVar10 & 0xffffffff);
        uVar1 = bufferSizeMilliseconds;
        uVar2 = clockMicros;
        uVar3 = clockPeripheral;
        uVar4 = DMAprimaryChannel;
        uVar5 = DMAsecondaryChannel;
        uVar6 = socketPort;
        uVar7 = memAllocMode;
        uVar8 = cfgInternals;
      }
      break;
    case 100:
      uVar10 = getNum((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffe4 = (uint)uVar10;
      if (((int)in_stack_ffffffffffffffe4 < 0) ||
         (uVar1 = bufferSizeMilliseconds, uVar2 = clockMicros, uVar3 = clockPeripheral,
         uVar4 = in_stack_ffffffffffffffe4, uVar5 = DMAsecondaryChannel, uVar6 = socketPort,
         uVar7 = memAllocMode, uVar8 = cfgInternals, 0xe < (int)in_stack_ffffffffffffffe4)) {
        fatal("invalid -d option (%d)",uVar10 & 0xffffffff);
        uVar1 = bufferSizeMilliseconds;
        uVar2 = clockMicros;
        uVar3 = clockPeripheral;
        uVar4 = DMAprimaryChannel;
        uVar5 = DMAsecondaryChannel;
        uVar6 = socketPort;
        uVar7 = memAllocMode;
        uVar8 = cfgInternals;
      }
      break;
    case 0x65:
      uVar10 = getNum((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffe4 = (uint)uVar10;
      if (((int)in_stack_ffffffffffffffe4 < 0) ||
         (uVar1 = bufferSizeMilliseconds, uVar2 = clockMicros, uVar3 = clockPeripheral,
         uVar4 = DMAprimaryChannel, uVar5 = in_stack_ffffffffffffffe4, uVar6 = socketPort,
         uVar7 = memAllocMode, uVar8 = cfgInternals, 0xe < (int)in_stack_ffffffffffffffe4)) {
        fatal("invalid -e option (%d)",uVar10 & 0xffffffff);
        uVar1 = bufferSizeMilliseconds;
        uVar2 = clockMicros;
        uVar3 = clockPeripheral;
        uVar4 = DMAprimaryChannel;
        uVar5 = DMAsecondaryChannel;
        uVar6 = socketPort;
        uVar7 = memAllocMode;
        uVar8 = cfgInternals;
      }
      break;
    case 0x66:
      ifFlags = ifFlags | 1;
      break;
    case 0x67:
      foreground = 1;
      break;
    case 0x6b:
      ifFlags = ifFlags | 2;
      break;
    case 0x6c:
      ifFlags = ifFlags | 4;
      break;
    case 0x6d:
      ifFlags = ifFlags | 8;
      break;
    case 0x6e:
      in_stack_ffffffffffffffe0 = checkAddr(_addr);
      if ((in_stack_ffffffffffffffe0 == 0) || (0xff < numSockNetAddr)) {
        fatal("invalid -n option (%s)",_optarg);
        uVar1 = bufferSizeMilliseconds;
        uVar2 = clockMicros;
        uVar3 = clockPeripheral;
        uVar4 = DMAprimaryChannel;
        uVar5 = DMAsecondaryChannel;
        uVar6 = socketPort;
        uVar7 = memAllocMode;
        uVar8 = cfgInternals;
      }
      else {
        lVar11 = (long)numSockNetAddr;
        numSockNetAddr = numSockNetAddr + 1;
        sockNetAddr[lVar11] = in_stack_ffffffffffffffe0;
        uVar1 = bufferSizeMilliseconds;
        uVar2 = clockMicros;
        uVar3 = clockPeripheral;
        uVar4 = DMAprimaryChannel;
        uVar5 = DMAsecondaryChannel;
        uVar6 = socketPort;
        uVar7 = memAllocMode;
        uVar8 = cfgInternals;
      }
      break;
    case 0x70:
      uVar10 = getNum((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffe4 = (uint)uVar10;
      if (((int)in_stack_ffffffffffffffe4 < 0x400) ||
         (uVar1 = bufferSizeMilliseconds, uVar2 = clockMicros, uVar3 = clockPeripheral,
         uVar4 = DMAprimaryChannel, uVar5 = DMAsecondaryChannel, uVar6 = in_stack_ffffffffffffffe4,
         uVar7 = memAllocMode, uVar8 = cfgInternals, 32000 < (int)in_stack_ffffffffffffffe4)) {
        fatal("invalid -p option (%d)",uVar10 & 0xffffffff);
        uVar1 = bufferSizeMilliseconds;
        uVar2 = clockMicros;
        uVar3 = clockPeripheral;
        uVar4 = DMAprimaryChannel;
        uVar5 = DMAsecondaryChannel;
        uVar6 = socketPort;
        uVar7 = memAllocMode;
        uVar8 = cfgInternals;
      }
      break;
    case 0x73:
      uVar10 = getNum((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffe4 = (uint)uVar10;
      uVar1 = bufferSizeMilliseconds;
      uVar2 = in_stack_ffffffffffffffe4;
      uVar3 = clockPeripheral;
      uVar4 = DMAprimaryChannel;
      uVar5 = DMAsecondaryChannel;
      uVar6 = socketPort;
      uVar7 = memAllocMode;
      uVar8 = cfgInternals;
      if ((((1 < in_stack_ffffffffffffffe4 - 1) && (1 < in_stack_ffffffffffffffe4 - 4)) &&
          (in_stack_ffffffffffffffe4 != 8)) && (in_stack_ffffffffffffffe4 != 10)) {
        fatal("invalid -s option (%d)",uVar10 & 0xffffffff);
        uVar1 = bufferSizeMilliseconds;
        uVar2 = clockMicros;
        uVar3 = clockPeripheral;
        uVar4 = DMAprimaryChannel;
        uVar5 = DMAsecondaryChannel;
        uVar6 = socketPort;
        uVar7 = memAllocMode;
        uVar8 = cfgInternals;
      }
      break;
    case 0x74:
      uVar10 = getNum((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffe4 = (uint)uVar10;
      if (((int)in_stack_ffffffffffffffe4 < 0) ||
         (uVar1 = bufferSizeMilliseconds, uVar2 = clockMicros, uVar3 = in_stack_ffffffffffffffe4,
         uVar4 = DMAprimaryChannel, uVar5 = DMAsecondaryChannel, uVar6 = socketPort,
         uVar7 = memAllocMode, uVar8 = cfgInternals, 1 < (int)in_stack_ffffffffffffffe4)) {
        fatal("invalid -t option (%d)",uVar10 & 0xffffffff);
        uVar1 = bufferSizeMilliseconds;
        uVar2 = clockMicros;
        uVar3 = clockPeripheral;
        uVar4 = DMAprimaryChannel;
        uVar5 = DMAsecondaryChannel;
        uVar6 = socketPort;
        uVar7 = memAllocMode;
        uVar8 = cfgInternals;
      }
      break;
    case 0x78:
      in_stack_ffffffffffffffd8 =
           (int *)getNum((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffd8);
      if (local_18 == 0) {
        updateMaskSet = 1;
        uVar1 = bufferSizeMilliseconds;
        uVar2 = clockMicros;
        uVar3 = clockPeripheral;
        uVar4 = DMAprimaryChannel;
        uVar5 = DMAsecondaryChannel;
        uVar6 = socketPort;
        updateMask = (uint64_t)in_stack_ffffffffffffffd8;
        uVar7 = memAllocMode;
        uVar8 = cfgInternals;
      }
      else {
        fatal("invalid -x option (%s)",_optarg);
        uVar1 = bufferSizeMilliseconds;
        uVar2 = clockMicros;
        uVar3 = clockPeripheral;
        uVar4 = DMAprimaryChannel;
        uVar5 = DMAsecondaryChannel;
        uVar6 = socketPort;
        uVar7 = memAllocMode;
        uVar8 = cfgInternals;
      }
    }
  }
  return;
}

Assistant:

static void initOpts(int argc, char *argv[])
{
   int opt, err, i;
   uint32_t addr;
   int64_t mask;

   while ((opt = getopt(argc, argv, "a:b:c:d:e:fgkln:mp:s:t:x:vV")) != -1)
   {
      switch (opt)
      {
         case 'a':
            i = getNum(optarg, &err);
            if ((i >= PI_MEM_ALLOC_AUTO) && (i <= PI_MEM_ALLOC_MAILBOX))
               memAllocMode = i;
            else fatal("invalid -a option (%d)", i);
            break;

         case 'b':
            i = getNum(optarg, &err);
            if ((i >= PI_BUF_MILLIS_MIN) && (i <= PI_BUF_MILLIS_MAX))
               bufferSizeMilliseconds = i;
            else fatal("invalid -b option (%d)", i);
            break;

         case 'c':
            i = getNum(optarg, &err);
            if ((i >= 0) && (i < PI_CFG_ILLEGAL_VAL))
               cfgInternals = i;
            else fatal("invalid -c option (%x)", i);
            break;

         case 'd':
            i = getNum(optarg, &err);
            if ((i >= PI_MIN_DMA_CHANNEL) && (i <= PI_MAX_DMA_CHANNEL))
               DMAprimaryChannel = i;
            else fatal("invalid -d option (%d)", i);
            break;

         case 'e':
            i = getNum(optarg, &err);
            if ((i >= PI_MIN_DMA_CHANNEL) && (i <= PI_MAX_DMA_CHANNEL))
               DMAsecondaryChannel = i;
            else fatal("invalid -e option (%d)", i);
            break;

         case 'f':
            ifFlags |= PI_DISABLE_FIFO_IF;
            break; 

         case 'g':
            foreground = 1;
            break;

         case 'k':
            ifFlags |= PI_DISABLE_SOCK_IF;
            break; 

         case 'l':
            ifFlags |= PI_LOCALHOST_SOCK_IF;
            break; 

         case 'm':
            ifFlags |= PI_DISABLE_ALERT;
            break; 

         case 'n':
            addr = checkAddr(optarg);
            if (addr && (numSockNetAddr<MAX_CONNECT_ADDRESSES))
               sockNetAddr[numSockNetAddr++] = addr;
            else fatal("invalid -n option (%s)", optarg);
            break; 

         case 'p':
            i = getNum(optarg, &err);
            if ((i >= PI_MIN_SOCKET_PORT) && (i <= PI_MAX_SOCKET_PORT))
               socketPort = i;
            else fatal("invalid -p option (%d)", i);
            break;

         case 's':
            i = getNum(optarg, &err);

            switch(i)
            {
               case 1:
               case 2:
               case 4:
               case 5:
               case 8:
               case 10:
                  clockMicros = i;
                  break;

               default:
                  fatal("invalid -s option (%d)", i);
                  break;
            }
            break;

         case 't':
            i = getNum(optarg, &err);
            if ((i >= PI_CLOCK_PWM) && (i <= PI_CLOCK_PCM))
               clockPeripheral = i;
            else fatal("invalid -t option (%d)", i);
            break;

         case 'v':
         case 'V':
            printf("%d\n", PIGPIO_VERSION);
            exit(EXIT_SUCCESS);
            break;

         case 'x':
            mask = getNum(optarg, &err);
            if (!err)
            {
               updateMask = mask;
               updateMaskSet = 1;
            }
            else fatal("invalid -x option (%s)", optarg);
            break;

        default: /* '?' */
           usage();
           exit(EXIT_FAILURE);
        }
    }
}